

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_function_proto_lineNumber(JSContext *ctx,JSValue this_val)

{
  JSValue val;
  JSValue JVar1;
  JSFunctionBytecode *pJVar2;
  int64_t in_RDI;
  JSFunctionBytecode *b;
  JSValueUnion in_stack_ffffffffffffffb0;
  int local_30;
  undefined4 uStack_2c;
  int64_t local_28;
  undefined4 uStack_c;
  
  val.tag = in_RDI;
  val.u.float64 = in_stack_ffffffffffffffb0.float64;
  pJVar2 = JS_GetFunctionBytecode(val);
  if ((pJVar2 == (JSFunctionBytecode *)0x0) ||
     (((byte)((ushort)*(undefined2 *)&pJVar2->field_0x19 >> 10) & 1) == 0)) {
    local_30 = 0;
    local_28 = 3;
  }
  else {
    local_30 = (pJVar2->debug).line_num;
    uStack_2c = uStack_c;
    local_28 = 0;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_function_proto_lineNumber(JSContext *ctx,
                                            JSValueConst this_val)
{
    JSFunctionBytecode *b = JS_GetFunctionBytecode(this_val);
    if (b && b->has_debug) {
        return JS_NewInt32(ctx, b->debug.line_num);
    }
    return JS_UNDEFINED;
}